

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_peobj.c
# Opt level: O3

void emit_peobj_sym(BuildCtx *ctx,char *name,uint32_t value,int sect,int type,int scl)

{
  size_t sVar1;
  size_t __n;
  char *__dest;
  PEsym sym;
  undefined4 local_44;
  undefined4 local_40;
  uint32_t local_3c;
  short local_38;
  undefined2 local_36;
  undefined1 local_34;
  undefined1 local_33;
  
  __n = strlen(name);
  sVar1 = strtabofs;
  if (strtab == (char *)0x0) {
    if (8 < __n) {
      strtabofs = strtabofs + __n + 1;
    }
  }
  else {
    if (__n < 9) {
      memcpy(&local_44,name,__n);
      memset((void *)((long)&local_44 + __n),0,8 - __n);
    }
    else {
      local_44 = 0;
      local_40 = (undefined4)strtabofs;
      __dest = strtab + strtabofs;
      memcpy(__dest,name,__n);
      __dest[__n] = '\0';
      strtabofs = sVar1 + __n + 1;
    }
    local_38 = (short)sect + 1;
    local_36 = (undefined2)type;
    local_34 = (undefined1)scl;
    local_33 = 0;
    local_3c = value;
    owrite(ctx,&local_44,0x12);
  }
  return;
}

Assistant:

static void emit_peobj_sym(BuildCtx *ctx, const char *name, uint32_t value,
			   int sect, int type, int scl)
{
  PEsym sym;
  size_t len = strlen(name);
  if (!strtab) {  /* Pass 1: only calculate string table length. */
    if (len > 8) strtabofs += len+1;
    return;
  }
  if (len <= 8) {
    memcpy(sym.n.name, name, len);
    memset(sym.n.name+len, 0, 8-len);
  } else {
    sym.n.nameref[0] = 0;
    sym.n.nameref[1] = (uint32_t)strtabofs;
    memcpy(strtab + strtabofs, name, len);
    strtab[strtabofs+len] = 0;
    strtabofs += len+1;
  }
  sym.value = value;
  sym.sect = (int16_t)(sect+1);  /* 1-based section number. */
  sym.type = (uint16_t)type;
  sym.scl = (uint8_t)scl;
  sym.naux = 0;
  owrite(ctx, &sym, PEOBJ_SYM_SIZE);
}